

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS ref_recon_rsn_hess(REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *hessian)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *vector;
  uint uVar1;
  uint uVar2;
  REF_CLOUD *one_layer;
  ulong uVar3;
  long lVar4;
  undefined8 uVar5;
  REF_DBL *pRVar6;
  REF_STATUS RVar7;
  ulong uVar8;
  REF_GLOB center_global;
  char *pcVar9;
  REF_CLOUD *ref_cloud_ptr;
  long lVar10;
  REF_INT node;
  REF_CLOUD ref_cloud;
  REF_DBL *local_c0;
  REF_GRID local_b8;
  REF_DBL *local_b0;
  REF_DBL node_hessian [3];
  REF_DBL n [3];
  REF_DBL s [3];
  REF_DBL r [3];
  
  ref_node = ref_grid->node;
  uVar8 = (ulong)ref_node->max;
  if ((long)uVar8 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x670,
           "ref_recon_rsn_hess","malloc one_layer of REF_CLOUD negative");
    RVar7 = 1;
  }
  else {
    ref_cell = ref_grid->cell[3];
    one_layer = (REF_CLOUD *)malloc(uVar8 * 8);
    if (one_layer == (REF_CLOUD *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x670
             ,"ref_recon_rsn_hess","malloc one_layer of REF_CLOUD NULL");
      RVar7 = 2;
    }
    else {
      for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
        one_layer[uVar3] = (REF_CLOUD)0x0;
      }
      ref_cloud_ptr = one_layer;
      local_c0 = hessian;
      local_b8 = ref_grid;
      local_b0 = scalar;
      for (lVar10 = 0; lVar10 < (int)uVar8; lVar10 = lVar10 + 1) {
        if (-1 < ref_node->global[lVar10]) {
          uVar1 = ref_cloud_create(ref_cloud_ptr,4);
          if (uVar1 != 0) {
            uVar8 = (ulong)uVar1;
            pcVar9 = "cloud storage";
            uVar5 = 0x672;
            goto LAB_001d075b;
          }
          uVar8 = (ulong)(uint)ref_node->max;
        }
        ref_cloud_ptr = ref_cloud_ptr + 1;
      }
      uVar1 = ref_recon_local_immediate_cloud(one_layer,ref_node,ref_cell,local_b0);
      if (uVar1 == 0) {
        uVar1 = ref_recon_ghost_cloud(one_layer,ref_node);
        if (uVar1 == 0) {
          lVar10 = 0;
          pRVar6 = local_c0;
          while( true ) {
            vector = local_c0;
            uVar8 = (ulong)ref_node->max;
            if ((long)uVar8 <= lVar10) break;
            if ((-1 < ref_node->global[lVar10]) && (ref_node->ref_mpi->id == ref_node->part[lVar10])
               ) {
              node = (REF_INT)lVar10;
              uVar1 = ref_recon_rsn(local_b8,node,r,s,n);
              if (uVar1 != 0) {
                uVar8 = (ulong)uVar1;
                pcVar9 = "rsn";
                uVar5 = 0x67a;
                goto LAB_001d075b;
              }
              uVar1 = ref_cloud_deep_copy(&ref_cloud,one_layer[lVar10]);
              if (uVar1 != 0) {
                uVar8 = (ulong)uVar1;
                pcVar9 = "create ref_cloud";
                uVar5 = 0x67c;
                goto LAB_001d075b;
              }
              uVar2 = 3;
              for (uVar1 = 2; (uVar2 != 0 && (uVar1 < 9)); uVar1 = uVar1 + 1) {
                uVar2 = ref_recon_grow_cloud_one_layer(ref_cloud,one_layer,ref_node);
                if (uVar2 != 0) {
                  uVar8 = (ulong)uVar2;
                  pcVar9 = "grow";
                  uVar5 = 0x680;
                  goto LAB_001d075b;
                }
                center_global = -1;
                if (lVar10 < ref_node->max) {
                  center_global = ref_node->global[lVar10];
                  if (ref_node->global[lVar10] < 0) {
                    center_global = -1;
                  }
                }
                uVar2 = ref_recon_kexact_rs(center_global,ref_cloud,r,s,node_hessian);
                pcVar9 = "REF_DIV_ZERO";
                if ((uVar2 == 4 && 4 < uVar1) ||
                   (pcVar9 = "REF_ILL_CONDITIONED", uVar2 == 8 && 4 < uVar1)) {
                  ref_node_location(ref_node,node);
                  printf(" caught %s, for %d layers to kexact cloud; retry\n",pcVar9,(ulong)uVar1);
                }
              }
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x68f,"ref_recon_rsn_hess",(ulong)uVar2,"kexact qr node");
                ref_node_location(ref_node,node);
                return uVar2;
              }
              for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
                pRVar6[lVar4] = node_hessian[lVar4];
              }
              uVar1 = ref_cloud_free(ref_cloud);
              if (uVar1 != 0) {
                uVar8 = (ulong)uVar1;
                pcVar9 = "free ref_cloud";
                uVar5 = 0x693;
                goto LAB_001d075b;
              }
            }
            lVar10 = lVar10 + 1;
            pRVar6 = pRVar6 + 3;
          }
          for (lVar10 = 0; lVar10 < (int)uVar8; lVar10 = lVar10 + 1) {
            if (-1 < ref_node->global[lVar10]) {
              ref_cloud_free(one_layer[lVar10]);
              uVar8 = (ulong)(uint)ref_node->max;
            }
          }
          free(one_layer);
          uVar1 = ref_node_ghost_dbl(ref_node,vector,3);
          if (uVar1 == 0) {
            uVar1 = ref_recon_abs_value_hessian2(local_b8,vector);
            if (uVar1 == 0) {
              return 0;
            }
            uVar8 = (ulong)uVar1;
            pcVar9 = "abs(H)";
            uVar5 = 0x69e;
          }
          else {
            uVar8 = (ulong)uVar1;
            pcVar9 = "update ghosts";
            uVar5 = 0x69c;
          }
        }
        else {
          uVar8 = (ulong)uVar1;
          pcVar9 = "fill ghosts";
          uVar5 = 0x676;
        }
      }
      else {
        uVar8 = (ulong)uVar1;
        pcVar9 = "fill immediate cloud";
        uVar5 = 0x675;
      }
LAB_001d075b:
      RVar7 = (REF_STATUS)uVar8;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar5
             ,"ref_recon_rsn_hess",uVar8,pcVar9);
    }
  }
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_recon_rsn_hess(REF_GRID ref_grid, REF_DBL *scalar,
                                      REF_DBL *hessian) {
  REF_CLOUD *one_layer;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node, im;
  REF_CLOUD ref_cloud;
  REF_DBL r[3], s[3], n[3];
  REF_DBL node_hessian[3];
  REF_STATUS status;
  REF_INT layer;

  ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
  }
  RSS(ref_recon_local_immediate_cloud(one_layer, ref_node, ref_cell, scalar),
      "fill immediate cloud");
  RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_recon_rsn(ref_grid, node, r, s, n), "rsn");
      /* use ref_cloud to get a unique list of halo(2) nodes */
      RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]), "create ref_cloud");
      status = REF_INVALID;
      for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
        RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
            "grow");

        status = ref_recon_kexact_rs(ref_node_global(ref_node, node), ref_cloud,
                                     r, s, node_hessian);
        if (REF_DIV_ZERO == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_DIV_ZERO", layer);
        }
        if (REF_ILL_CONDITIONED == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_ILL_CONDITIONED", layer);
        }
      }
      RSB(status, "kexact qr node", { ref_node_location(ref_node, node); });
      for (im = 0; im < 3; im++) {
        hessian[im + 3 * node] = node_hessian[im];
      }
      RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    ref_cloud_free(one_layer[node]); /* no-op for null */
  }
  ref_free(one_layer);

  RSS(ref_node_ghost_dbl(ref_node, hessian, 3), "update ghosts");

  RSS(ref_recon_abs_value_hessian2(ref_grid, hessian), "abs(H)");

  return REF_SUCCESS;
}